

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O3

void Minisat::sort<int,Minisat::LessThan_default<int>>(int *array,ulong param_2)

{
  ulong uVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int *__dest;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  int *piVar19;
  int *piVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  int *__src;
  
  piVar19 = array;
  if (0xf < (int)param_2) {
    do {
      uVar17 = (uint)param_2;
      param_2 = param_2 & 0xffffffff;
      if (0x20 < uVar17) {
        __dest = (int *)operator_new__(param_2 * 4);
        uVar18 = 1;
        bVar5 = false;
        do {
          bVar6 = bVar5;
          __src = __dest;
          __dest = piVar19;
          uVar4 = uVar18 * 2;
          uVar14 = 0;
          piVar19 = __src;
          uVar9 = uVar4;
          uVar22 = uVar18;
          do {
            uVar8 = uVar9;
            if ((int)uVar17 < (int)uVar9) {
              uVar8 = uVar17;
            }
            uVar10 = (long)(int)uVar4 + uVar14;
            uVar13 = (uint)uVar10;
            if ((int)uVar17 < (int)(uint)uVar10) {
              uVar13 = uVar17;
            }
            uVar1 = uVar14 + (long)(int)uVar18;
            uVar11 = (uint)uVar1;
            uVar24 = uVar18 + uVar11;
            if ((int)uVar17 <= (int)(uVar18 + uVar11)) {
              uVar24 = uVar17;
            }
            uVar7 = (uint)uVar14;
            if (((int)uVar18 < 1) || ((long)(int)uVar24 <= (long)uVar1)) {
              lVar23 = (long)(int)uVar7;
              uVar12 = uVar7;
              uVar15 = uVar7;
            }
            else {
              uVar16 = uVar14 & 0xffffffff;
              uVar25 = uVar1 & 0xffffffff;
              uVar14 = uVar14 & 0xffffffff;
              piVar20 = piVar19;
              do {
                lVar23 = (long)(int)uVar14;
                piVar2 = __dest + lVar23;
                iVar21 = __dest[(int)uVar25];
                if (*piVar2 < iVar21) {
                  uVar11 = (int)uVar14 + 1;
                  uVar14 = (ulong)uVar11;
                  lVar23 = (long)(int)uVar11;
                  iVar21 = *piVar2;
                }
                else {
                  uVar25 = (ulong)((int)uVar25 + 1);
                }
                uVar11 = (uint)uVar25;
                uVar12 = (uint)uVar14;
                *piVar20 = iVar21;
                uVar15 = (int)uVar16 + 1;
                uVar16 = (ulong)uVar15;
              } while ((lVar23 < (long)uVar1) && (piVar20 = piVar20 + 1, (int)uVar11 < (int)uVar24))
              ;
            }
            if (lVar23 < (long)uVar1) {
              memcpy(__src + (int)uVar15,__dest + lVar23,
                     (ulong)((uVar7 + (uVar18 - 1)) - uVar12) * 4 + 4);
              uVar15 = (uVar15 + uVar22) - (int)lVar23;
            }
            if ((int)uVar11 < (int)uVar24) {
              memcpy(__src + (int)uVar15,__dest + (int)uVar11,(ulong)(uVar13 + ~uVar11) * 4 + 4);
              uVar15 = (uVar15 + uVar8) - uVar11;
            }
            uVar22 = uVar22 + uVar4;
            uVar9 = uVar9 + uVar4;
            piVar19 = piVar19 + (int)uVar4;
            uVar14 = uVar10;
          } while ((long)uVar10 < (long)(param_2 - (long)(int)uVar18));
          if ((int)uVar15 < (int)uVar17) {
            memcpy(__src + (int)uVar15,__dest + (int)uVar15,(ulong)(~uVar15 + uVar17) * 4 + 4);
          }
          piVar19 = __src;
          uVar18 = uVar4;
          bVar5 = (bool)(bVar6 ^ 1);
        } while ((int)uVar4 < (int)uVar17);
        if (!bVar6) {
          memcpy(__dest,__src,param_2 * 4);
          __dest = __src;
        }
        if (__dest == (int *)0x0) {
          return;
        }
        operator_delete__(__dest);
        return;
      }
      iVar21 = piVar19[param_2 >> 1];
      uVar14 = 0xffffffffffffffff;
      while( true ) {
        uVar14 = (ulong)(int)uVar14;
        array = piVar19 + uVar14;
        do {
          uVar14 = uVar14 + 1;
          iVar3 = array[1];
          array = array + 1;
        } while (iVar3 < iVar21);
        param_2 = (ulong)(int)param_2;
        do {
          lVar23 = param_2 - 1;
          param_2 = param_2 - 1;
        } while (iVar21 < piVar19[lVar23]);
        if ((long)param_2 <= (long)uVar14) break;
        *array = piVar19[lVar23];
        piVar19[param_2] = iVar3;
      }
      sort<int,Minisat::LessThan_default<int>>(piVar19,uVar14 & 0xffffffff);
      uVar18 = uVar17 - (int)uVar14;
      param_2 = (ulong)uVar18;
      piVar19 = array;
    } while (0xf < (int)uVar18);
    param_2 = (ulong)(uVar17 - (int)uVar14);
  }
  selectionSort<int,Minisat::LessThan_default<int>>(array,param_2);
  return;
}

Assistant:

void sort(T *array, int size, LessThan lt)
{
    if (size <= 15) {
        selectionSort(array, size, lt);
    } else if (size > 32) {
        mergesort(array, size, lt);
    } else {
        T pivot = array[size / 2];
        T tmp;
        int i = -1;
        int j = size;

        for (;;) {
            do
                i++;
            while (lt(array[i], pivot));
            do
                j--;
            while (lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i];
            array[i] = array[j];
            array[j] = tmp;
        }

        sort(array, i, lt);
        sort(&array[i], size - i, lt);
    }
}